

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Expression * __thiscall
soul::heart::Parser::parseExpression(Parser *this,FunctionParseState *state,Type *requiredType)

{
  Expression *pEVar1;
  CodeLocation errorPos;
  CodeLocation local_20;
  
  local_20.sourceCode.object =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if (local_20.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_20.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_20.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_20.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  pEVar1 = parseExpression(this,state);
  pEVar1 = checkExpressionType(this,pEVar1,requiredType,&local_20);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_20.sourceCode);
  return pEVar1;
}

Assistant:

heart::Expression& parseExpression (const FunctionParseState& state, const Type& requiredType)
    {
        auto errorPos = location;
        return checkExpressionType (parseExpression (state), requiredType, errorPos);
    }